

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParamConstraint.hpp
# Opt level: O2

void __thiscall
OpenMD::EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(EqualIgnoreCaseConstraint *this)

{
  std::__cxx11::string::~string((string *)&this->rhs_);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

EqualIgnoreCaseConstraint(std::string rhs) :
        rhs_(OpenMD::toUpperCopy(rhs)) {
      std::stringstream iss;
      iss << "equal to (case insensitive) " << rhs;
      this->description_ = iss.str();
    }